

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O1

void __thiscall
CLI::ExtrasError::ExtrasError
          (ExtrasError *this,string *name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  string *in_RCX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  ulong uVar4;
  char *__s;
  string local_b0;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  pcVar1 = (name->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + name->_M_string_length);
  uVar4 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  __s = "The following argument was not expected: ";
  if (0x20 < uVar4) {
    __s = "The following arguments were not expected: ";
  }
  local_90._0_8_ = (pointer)(local_90 + 0x10);
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_90," ","");
  detail::rjoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_50,(detail *)args,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_90,in_RCX);
  pbVar2 = ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,0,
                   0,__s,(ulong)(0x20 < uVar4) * 2 + 0x29);
  local_b0._M_dataplus._M_p = (pbVar2->_M_dataplus)._M_p;
  paVar3 = &pbVar2->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar3) {
    local_b0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar2->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar2->_M_string_length;
  (pbVar2->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar2->_M_string_length = 0;
  (pbVar2->field_2)._M_local_buf[0] = '\0';
  ExtrasError(this,&local_70,&local_b0,ExtrasError);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_90._0_8_ != (pointer)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,
                    (size_t)((long)&((_Alloc_hider *)local_90._16_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ExtrasError(const std::string &name, std::vector<std::string> args)
        : ExtrasError(name,
                      (args.size() > 1 ? "The following arguments were not expected: "
                                       : "The following argument was not expected: ") +
                          detail::rjoin(args, " "),
                      ExitCodes::ExtrasError) {}